

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  ImVec2 *pIVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  ImGuiContextHook *pIVar7;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var8;
  ImGuiViewportP *pIVar9;
  ImGuiWindow *pIVar10;
  ImGuiViewport **ppIVar11;
  ImGuiWindow **ppIVar12;
  unsigned_short *puVar13;
  ImVec2 IVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  ImU32 IVar24;
  ImGuiContext *g_1;
  ImGuiWindow *pIVar25;
  ImGuiWindow *pIVar26;
  ImDrawList *pIVar27;
  ImGuiViewport *pIVar28;
  ImGuiViewport **ppIVar29;
  ImGuiWindow **ppIVar30;
  ulong uVar31;
  unsigned_short *__dest;
  int iVar32;
  ImGuiContext *g_4;
  char *pcVar33;
  char *label;
  char *pcVar34;
  byte bVar35;
  ImGuiContext *g;
  ImGuiContext *g_2;
  ImGuiWindow *window;
  int iVar36;
  long lVar37;
  int iVar38;
  ImGuiContext *ctx;
  long lVar39;
  ulong uVar40;
  uint uVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  ImRect outer;
  ImRect inner;
  undefined1 local_a8 [12];
  float fStack_9c;
  undefined1 local_98 [16];
  ImGuiContext *local_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar20 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1187,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x118c,"void ImGui::EndFrame()");
  }
  if (0 < (GImGui->Hooks).Size) {
    lVar37 = 0;
    lVar39 = 0;
    do {
      pIVar7 = (pIVar20->Hooks).Data;
      if (*(int *)(pIVar7 + lVar37) == 2) {
        (**(code **)(pIVar7 + lVar37 + 8))(pIVar20);
      }
      lVar39 = lVar39 + 1;
      lVar37 = lVar37 + 0x18;
    } while (lVar39 < (pIVar20->Hooks).Size);
  }
  bVar6 = (GImGui->IO).KeyCtrl;
  uVar41 = bVar6 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar41 = (uint)bVar6;
  }
  uVar42 = uVar41 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar42 = uVar41;
  }
  uVar41 = uVar42 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar41 = uVar42;
  }
  if ((GImGui->IO).KeyMods != uVar41) {
    __assert_fail("g.IO.KeyMods == expected_key_mod_flags && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1dd0,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar36 = (GImGui->CurrentWindowStack).Size;
  if (iVar36 != 1) {
    if (1 < iVar36) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dd9,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1ddf,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var8 = (pIVar20->PlatformIO).Platform_SetImeInputPos;
  if (p_Var8 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
    fVar43 = (pIVar20->PlatformImeLastPos).x;
    if ((((fVar43 == 3.4028235e+38) && (!NAN(fVar43))) ||
        (fVar43 = (pIVar20->PlatformImePos).x - fVar43,
        fVar44 = (pIVar20->PlatformImePos).y - (pIVar20->PlatformImeLastPos).y,
        0.0001 < fVar43 * fVar43 + fVar44 * fVar44)) &&
       ((pIVar9 = pIVar20->PlatformImePosViewport, pIVar9 != (ImGuiViewportP *)0x0 &&
        (pIVar9->PlatformWindowCreated == true)))) {
      (*p_Var8)(&pIVar9->super_ImGuiViewport,pIVar20->PlatformImePos);
      pIVar20->PlatformImeLastPos = pIVar20->PlatformImePos;
      pIVar20->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
  }
  pIVar20->WithinFrameScopeWithImplicitWindow = false;
  local_80 = pIVar20;
  pIVar25 = pIVar20->CurrentWindow;
  if ((pIVar25 != (ImGuiWindow *)0x0) && (pIVar25->WriteAccessed == false)) {
    pIVar25->Active = false;
  }
  End();
  pIVar20 = GImGui;
  pIVar25 = GetTopMostPopupModal();
  local_68 = (ImVec2)pIVar20->NavWindowingTargetAnim;
  pIVar26 = (ImGuiWindow *)((ulong)pIVar25 | (ulong)local_68);
  if ((pIVar26 != (ImGuiWindow *)0x0) && (0 < (pIVar20->Viewports).Size)) {
    lVar37 = 0;
    local_98._0_8_ = (0x31 - (ulong)(pIVar25 == (ImGuiWindow *)0x0)) * 0x10;
    do {
      pIVar9 = (pIVar20->Viewports).Data[lVar37];
      if ((((pIVar25 == (ImGuiWindow *)0x0) || (pIVar9 != pIVar25->Viewport)) &&
          ((pIVar20->NavWindowingListWindow == (ImGuiWindow *)0x0 ||
           (pIVar9 != pIVar20->NavWindowingListWindow->Viewport)))) &&
         ((pIVar20->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
          (pIVar9 != pIVar20->NavWindowingTargetAnim->Viewport)))) {
        pIVar27 = GetViewportDrawList(pIVar9,1,"##Foreground");
        pIVar3 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + local_98._0_8_);
        local_a8._0_8_ = *pIVar3;
        IVar14 = pIVar3[1];
        fStack_9c = IVar14.y;
        local_a8._8_4_ = IVar14.x;
        fStack_9c = pIVar20->DimBgRatio * (GImGui->Style).Alpha * fStack_9c;
        IVar24 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
        local_a8._4_4_ = (pIVar9->super_ImGuiViewport).Pos.y + (pIVar9->super_ImGuiViewport).Size.y;
        local_a8._0_4_ = (pIVar9->super_ImGuiViewport).Pos.x + (pIVar9->super_ImGuiViewport).Size.x;
        ImDrawList::AddRectFilled
                  (pIVar27,&(pIVar9->super_ImGuiViewport).Pos,(ImVec2 *)local_a8,IVar24,0.0,0xf);
      }
      lVar37 = lVar37 + 1;
      pIVar26 = (ImGuiWindow *)(long)(pIVar20->Viewports).Size;
    } while (lVar37 < (long)pIVar26);
  }
  if ((local_68 != (ImVec2)0x0) &&
     (pIVar25 = pIVar20->NavWindowingTargetAnim, pIVar25->Active == true)) {
    pIVar26 = FindFrontMostVisibleChildWindow(pIVar26);
    pIVar27 = pIVar26->DrawList;
    ImDrawList::PushClipRectFullScreen(pIVar27);
    pIVar26 = pIVar25->RootWindowDockStop;
    if (((pIVar26->field_0x492 & 1) != 0) && (pIVar10 = pIVar25->RootWindow, pIVar10 != pIVar26)) {
      local_98._4_4_ = (pIVar10->Pos).y + (pIVar10->Size).y;
      local_98._0_4_ = (pIVar10->Pos).x + (pIVar10->Size).x;
      local_98._8_8_ = 0;
      local_68 = pIVar26->Pos;
      uStack_60 = 0;
      local_48 = pIVar10->Pos;
      uStack_40 = 0;
      local_a8._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0x30);
      uVar15 = (GImGui->Style).Colors[0x30].z;
      uVar16 = (GImGui->Style).Colors[0x30].w;
      local_58.y = (pIVar26->Pos).y + (pIVar26->Size).y;
      local_58.x = (pIVar26->Pos).x + (pIVar26->Size).x;
      uStack_50 = 0;
      fStack_9c = pIVar20->DimBgRatio * (GImGui->Style).Alpha * (float)uVar16;
      local_a8._8_4_ = uVar15;
      IVar24 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
      auVar23 = local_98;
      outer.Max.x = (float)local_98._0_4_;
      outer.Max.y = (float)local_98._4_4_;
      outer.Min = local_48;
      inner.Max = local_58;
      inner.Min = local_68;
      local_98 = auVar23;
      RenderRectFilledWithHole(pIVar27,outer,inner,IVar24,(pIVar20->Style).WindowRounding);
    }
    fVar43 = pIVar25->WindowRounding;
    fVar44 = (pIVar20->Style).WindowRounding;
    uVar41 = -(uint)(fVar44 <= fVar43);
    local_98 = ZEXT416(~uVar41 & (uint)fVar44 | uVar41 & (uint)fVar43);
    fVar44 = pIVar20->FontSize;
    local_78.x = (pIVar25->Pos).x;
    local_78.y = (pIVar25->Pos).y;
    local_78.x = local_78.x - fVar44;
    local_78.y = local_78.y - fVar44;
    IStack_70.x = (pIVar25->Pos).x + (pIVar25->Size).x + fVar44;
    IStack_70.y = (pIVar25->Pos).y + (pIVar25->Size).y + fVar44;
    pIVar9 = pIVar25->Viewport;
    fVar4 = (pIVar9->super_ImGuiViewport).Pos.x;
    if ((((local_78.x <= fVar4) &&
         (fVar5 = (pIVar9->super_ImGuiViewport).Pos.y, local_78.y <= fVar5)) &&
        (fVar4 + (pIVar9->super_ImGuiViewport).Size.x <= IStack_70.x)) &&
       (fVar5 + (pIVar9->super_ImGuiViewport).Size.y <= IStack_70.y)) {
      fVar44 = -1.0 - fVar44;
      local_78.y = local_78.y - fVar44;
      local_78.x = local_78.x - fVar44;
      IStack_70.y = fVar44 + IStack_70.y;
      IStack_70.x = IStack_70.x + fVar44;
      local_98 = ZEXT416((uint)fVar43);
    }
    local_a8._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0x2f);
    uVar17 = (GImGui->Style).Colors[0x2f].z;
    uVar18 = (GImGui->Style).Colors[0x2f].w;
    fStack_9c = pIVar20->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar18;
    local_a8._8_4_ = uVar17;
    IVar24 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
    ImDrawList::AddRect(pIVar27,&local_78,&IStack_70,IVar24,(float)local_98._0_4_,-1,3.0);
    ImDrawList::PopClipRect(pIVar27);
  }
  pIVar20 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      IVar24 = ImHashStr("###NavWindowingList",0,0);
      pIVar25 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar20->WindowsById,IVar24);
      pIVar20->NavWindowingListWindow = pIVar25;
    }
    pIVar28 = GetMainViewport();
    pIVar19 = GImGui;
    fVar43 = (pIVar28->Size).x;
    fVar44 = (pIVar28->Size).y;
    uVar41 = (GImGui->NextWindowData).Flags;
    (GImGui->NextWindowData).Flags = uVar41 | 0x10;
    (pIVar19->NextWindowData).SizeConstraintRect.Min.x = fVar43 * 0.2;
    (pIVar19->NextWindowData).SizeConstraintRect.Min.y = fVar44 * 0.2;
    (pIVar19->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar19->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar19->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar19->NextWindowData).SizeCallbackUserData = (void *)0x0;
    fVar43 = (pIVar28->Size).x;
    fVar44 = (pIVar28->Size).y;
    fVar4 = (pIVar28->Pos).x;
    fVar5 = (pIVar28->Pos).y;
    (pIVar19->NextWindowData).Flags = uVar41 | 0x11;
    IVar14.y = fVar44 * 0.5 + fVar5;
    IVar14.x = fVar43 * 0.5 + fVar4;
    (pIVar19->NextWindowData).PosVal = IVar14;
    (pIVar19->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar19->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar19->NextWindowData).PosCond = 1;
    (pIVar19->NextWindowData).PosUndock = true;
    fVar43 = (pIVar20->Style).WindowPadding.x;
    fVar44 = (pIVar20->Style).WindowPadding.y;
    local_a8._4_4_ = fVar44 + fVar44;
    local_a8._0_4_ = fVar43 + fVar43;
    PushStyleVar(1,(ImVec2 *)local_a8);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar37 = (long)(pIVar20->WindowsFocusOrder).Size;
    if (0 < lVar37) {
      do {
        if ((pIVar20->WindowsFocusOrder).Size < lVar37) goto LAB_00130385;
        pIVar25 = (pIVar20->WindowsFocusOrder).Data[lVar37 + -1];
        if (((pIVar25->Active == true) && (pIVar25->RootWindowDockStop == pIVar25)) &&
           (uVar41 = pIVar25->Flags, (uVar41 >> 0x13 & 1) == 0)) {
          pcVar34 = pIVar25->Name;
          pcVar33 = pcVar34;
          if (pcVar34 != (char *)0xffffffffffffffff) {
            do {
              if (*pcVar33 == '#') {
                if (pcVar33[1] == '#') goto LAB_0012fa01;
              }
              else if (*pcVar33 == '\0') goto LAB_0012fa01;
              pcVar33 = pcVar33 + 1;
            } while (pcVar33 != (char *)0xffffffffffffffff);
            pcVar33 = (char *)0xffffffffffffffff;
          }
LAB_0012fa01:
          label = pcVar34;
          if ((pcVar34 == pcVar33) && (label = "(Popup)", (uVar41 >> 0x1a & 1) == 0)) {
            if ((uVar41 >> 10 & 1) != 0) {
              iVar36 = strcmp(pcVar34,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar36 == 0) goto LAB_0012fa4f;
            }
            label = "(Dock node)";
            if (pIVar25->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              label = "(Untitled)";
            }
          }
LAB_0012fa4f:
          local_a8._0_4_ = 0.0;
          local_a8._4_4_ = 0.0;
          Selectable(label,pIVar20->NavWindowingTarget == pIVar25,0,(ImVec2 *)local_a8);
        }
        bVar6 = 1 < lVar37;
        lVar37 = lVar37 + -1;
      } while (bVar6);
    }
    End();
    PopStyleVar(1);
  }
  pIVar25 = pIVar20->NavWrapRequestWindow;
  if ((((pIVar25 != (ImGuiWindow *)0x0) && (pIVar20->NavWindow == pIVar25)) &&
      (GImGui->NavMoveRequest == true)) &&
     ((((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)) &&
      ((pIVar20->NavMoveRequestForward == ImGuiNavForward_None &&
       (pIVar20->NavLayer == ImGuiNavLayer_Main)))))) {
    uVar41 = pIVar20->NavWrapRequestFlags;
    if (uVar41 == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x264c,"void ImGui::NavEndFrame()");
    }
    local_a8._0_8_ = pIVar25->NavRectRel[0].Min;
    unique0x10000c3b = pIVar25->NavRectRel[0].Max;
    iVar36 = pIVar20->NavMoveDir;
    if (iVar36 == 0) {
      if ((uVar41 & 5) == 0) {
        iVar36 = 0;
      }
      else {
        fVar43 = (pIVar25->SizeFull).x;
        fVar44 = (pIVar25->WindowPadding).x;
        fVar44 = fVar44 + fVar44 + (pIVar25->ContentSize).x;
        uVar42 = -(uint)(fVar44 <= fVar43);
        fVar43 = (float)(uVar42 & (uint)fVar43 | ~uVar42 & (uint)fVar44) - (pIVar25->Scroll).x;
        iVar36 = 0;
        if ((uVar41 & 4) != 0) {
          fVar44 = fStack_9c - (float)local_a8._4_4_;
          local_a8._4_4_ = (float)local_a8._4_4_ - fVar44;
          fStack_9c = fStack_9c - fVar44;
          iVar36 = 2;
        }
        local_a8._8_4_ = fVar43;
        local_a8._0_4_ = fVar43;
        NavMoveRequestForward(0,iVar36,(ImRect *)local_a8,uVar41);
      }
    }
    if ((uVar41 & 5) != 0 && pIVar20->NavMoveDir == 1) {
      fVar43 = (pIVar25->Scroll).x;
      fVar44 = fStack_9c;
      stack0xffffffffffffff60 = (ImVec2)(CONCAT44(fStack_9c,fVar43) ^ 0x80000000);
      uVar21 = local_a8._4_4_;
      local_a8._0_8_ = CONCAT44(local_a8._4_4_,fVar43) ^ 0x80000000;
      if ((uVar41 & 4) != 0) {
        fVar43 = fVar44 - (float)uVar21;
        local_a8._4_4_ = (float)uVar21 + fVar43;
        fStack_9c = fVar43 + fVar44;
        iVar36 = 3;
      }
      NavMoveRequestForward(pIVar20->NavMoveDir,iVar36,(ImRect *)local_a8,uVar41);
    }
    if ((uVar41 & 10) != 0 && pIVar20->NavMoveDir == 2) {
      fVar43 = (pIVar25->SizeFull).y;
      fVar44 = (pIVar25->WindowPadding).y;
      fVar44 = fVar44 + fVar44 + (pIVar25->ContentSize).y;
      uVar42 = -(uint)(fVar44 <= fVar43);
      fVar43 = (float)(uVar42 & (uint)fVar43 | ~uVar42 & (uint)fVar44) - (pIVar25->Scroll).y;
      if ((uVar41 & 8) != 0) {
        fVar44 = (float)local_a8._8_4_ - (float)local_a8._0_4_;
        local_a8._0_4_ = (float)local_a8._0_4_ - fVar44;
        local_a8._8_4_ = (float)local_a8._8_4_ - fVar44;
        iVar36 = 0;
      }
      fStack_9c = fVar43;
      local_a8._4_4_ = fVar43;
      NavMoveRequestForward(pIVar20->NavMoveDir,iVar36,(ImRect *)local_a8,uVar41);
    }
    if (pIVar20->NavMoveDir == 3 && (uVar41 & 10) != 0) {
      fVar43 = (pIVar25->Scroll).y;
      uVar22 = local_a8._8_4_;
      stack0xffffffffffffff60 = (ImVec2)(CONCAT44(fVar43,local_a8._8_4_) ^ 0x8000000000000000);
      uVar21 = local_a8._0_4_;
      local_a8._0_8_ = CONCAT44(fVar43,local_a8._0_4_) ^ 0x8000000000000000;
      if ((uVar41 & 8) != 0) {
        fVar43 = (float)uVar22 - (float)uVar21;
        local_a8._0_4_ = (float)uVar21 + fVar43;
        local_a8._8_4_ = fVar43 + (float)uVar22;
        iVar36 = 1;
      }
      NavMoveRequestForward(pIVar20->NavMoveDir,iVar36,(ImRect *)local_a8,uVar41);
    }
  }
  pIVar19 = local_80;
  pIVar20 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar20->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  if (local_80->DragDropActive == true) {
    if ((local_80->DragDropPayload).DataFrameCount + 1 < local_80->FrameCount) {
      bVar35 = 1;
      if ((local_80->DragDropSourceFlags & 0x20) == 0) {
        if (4 < (ulong)(uint)local_80->DragDropMouseButton) {
          __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x12d9,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
        }
        bVar35 = (pIVar20->IO).MouseDown[(uint)local_80->DragDropMouseButton] ^ 1;
      }
    }
    else {
      bVar35 = 0;
    }
    if ((bVar35 != 0) || ((local_80->DragDropPayload).Delivery != false)) {
      ClearDragDrop();
    }
  }
  if (((pIVar19->DragDropActive == true) &&
      (pIVar19->DragDropSourceFrameCount < pIVar19->FrameCount)) &&
     ((pIVar19->DragDropSourceFlags & 1) == 0)) {
    pIVar19->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar19->DragDropWithinSource = false;
  }
  pIVar19->WithinFrameScope = false;
  pIVar19->FrameCountEnded = pIVar19->FrameCount;
  UpdateMouseMovingWindowEndFrame();
  pIVar20 = GImGui;
  if (0 < (GImGui->Viewports).Size) {
    (GImGui->PlatformIO).MainViewport = &(*(GImGui->Viewports).Data)->super_ImGuiViewport;
    iVar36 = (pIVar20->PlatformIO).Viewports.Capacity;
    if (iVar36 < 0) {
      uVar41 = iVar36 / 2 + iVar36;
      uVar31 = 0;
      if (0 < (int)uVar41) {
        uVar31 = (ulong)uVar41;
      }
      if (pIVar20 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar20->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar29 = (ImGuiViewport **)(*GImAllocatorAllocFunc)(uVar31 * 8,GImAllocatorUserData);
      ppIVar11 = (pIVar20->PlatformIO).Viewports.Data;
      if (ppIVar11 != (ImGuiViewport **)0x0) {
        memcpy(ppIVar29,ppIVar11,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
        ppIVar11 = (pIVar20->PlatformIO).Viewports.Data;
        if ((ppIVar11 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
      }
      (pIVar20->PlatformIO).Viewports.Data = ppIVar29;
      (pIVar20->PlatformIO).Viewports.Capacity = (int)uVar31;
    }
    (pIVar20->PlatformIO).Viewports.Size = 0;
    if (0 < (pIVar20->Viewports).Size) {
      lVar37 = 0;
      do {
        pIVar9 = (pIVar20->Viewports).Data[lVar37];
        pIVar9->LastPos = (pIVar9->super_ImGuiViewport).Pos;
        if ((pIVar9->LastFrameActive < pIVar20->FrameCount) ||
           ((pIVar9->super_ImGuiViewport).Size.x <= 0.0)) {
          if (lVar37 == 0) goto LAB_0012ff2d;
        }
        else if ((lVar37 == 0) || (0.0 < (pIVar9->super_ImGuiViewport).Size.y)) {
LAB_0012ff2d:
          pIVar25 = pIVar9->Window;
          if ((pIVar25 == (ImGuiWindow *)0x0) ||
             ((pIVar25->Active == true && (pIVar25->Hidden == false)))) {
            if ((lVar37 != 0) && (pIVar25 == (ImGuiWindow *)0x0)) {
              __assert_fail("viewport->Window != __null",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                            ,0x2c32,"void ImGui::UpdateViewportsEndFrame()");
            }
            iVar36 = (pIVar20->PlatformIO).Viewports.Size;
            iVar38 = (pIVar20->PlatformIO).Viewports.Capacity;
            if (iVar36 == iVar38) {
              if (iVar38 == 0) {
                iVar32 = 8;
              }
              else {
                iVar32 = iVar38 / 2 + iVar38;
              }
              iVar36 = iVar36 + 1;
              if (iVar36 < iVar32) {
                iVar36 = iVar32;
              }
              if (iVar38 < iVar36) {
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + 1;
                }
                ppIVar29 = (ImGuiViewport **)
                           (*GImAllocatorAllocFunc)((long)iVar36 << 3,GImAllocatorUserData);
                ppIVar11 = (pIVar20->PlatformIO).Viewports.Data;
                if (ppIVar11 != (ImGuiViewport **)0x0) {
                  memcpy(ppIVar29,ppIVar11,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
                  ppIVar11 = (pIVar20->PlatformIO).Viewports.Data;
                  if ((ppIVar11 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar1 = *piVar1 + -1;
                  }
                  (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
                }
                (pIVar20->PlatformIO).Viewports.Data = ppIVar29;
                (pIVar20->PlatformIO).Viewports.Capacity = iVar36;
              }
            }
            (pIVar20->PlatformIO).Viewports.Data[(pIVar20->PlatformIO).Viewports.Size] =
                 &pIVar9->super_ImGuiViewport;
            pIVar2 = &(pIVar20->PlatformIO).Viewports;
            pIVar2->Size = pIVar2->Size + 1;
          }
        }
        pIVar19 = local_80;
        lVar37 = lVar37 + 1;
        iVar36 = (pIVar20->Viewports).Size;
      } while (lVar37 < iVar36);
      if (0 < iVar36) {
        pIVar9 = *(pIVar20->Viewports).Data;
        (pIVar9->super_ImGuiViewport).PlatformRequestMove = false;
        (pIVar9->super_ImGuiViewport).PlatformRequestResize = false;
        (pIVar9->super_ImGuiViewport).PlatformRequestClose = false;
        iVar36 = (local_80->WindowsTempSortBuffer).Capacity;
        if (iVar36 < 0) {
          uVar41 = iVar36 / 2 + iVar36;
          uVar31 = 0;
          if (0 < (int)uVar41) {
            uVar31 = (ulong)uVar41;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          ppIVar30 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar31 * 8,GImAllocatorUserData);
          ppIVar12 = (pIVar19->WindowsTempSortBuffer).Data;
          if (ppIVar12 != (ImGuiWindow **)0x0) {
            memcpy(ppIVar30,ppIVar12,(long)(pIVar19->WindowsTempSortBuffer).Size << 3);
            ppIVar12 = (pIVar19->WindowsTempSortBuffer).Data;
            if ((ppIVar12 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar12,GImAllocatorUserData);
          }
          (pIVar19->WindowsTempSortBuffer).Data = ppIVar30;
          (pIVar19->WindowsTempSortBuffer).Capacity = (int)uVar31;
        }
        (pIVar19->WindowsTempSortBuffer).Size = 0;
        iVar36 = (pIVar19->Windows).Size;
        if ((pIVar19->WindowsTempSortBuffer).Capacity < iVar36) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          ppIVar30 = (ImGuiWindow **)
                     (*GImAllocatorAllocFunc)((long)iVar36 << 3,GImAllocatorUserData);
          ppIVar12 = (pIVar19->WindowsTempSortBuffer).Data;
          if (ppIVar12 != (ImGuiWindow **)0x0) {
            memcpy(ppIVar30,ppIVar12,(long)(pIVar19->WindowsTempSortBuffer).Size << 3);
            ppIVar12 = (pIVar19->WindowsTempSortBuffer).Data;
            if ((ppIVar12 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar12,GImAllocatorUserData);
          }
          (pIVar19->WindowsTempSortBuffer).Data = ppIVar30;
          (pIVar19->WindowsTempSortBuffer).Capacity = iVar36;
        }
        uVar41 = (pIVar19->Windows).Size;
        uVar31 = (ulong)uVar41;
        if (uVar41 != 0) {
          uVar40 = 0;
          do {
            if ((long)(int)uVar31 <= (long)uVar40) goto LAB_00130385;
            pIVar25 = (pIVar19->Windows).Data[uVar40];
            if ((pIVar25->Active != true) || ((pIVar25->Flags & 0x1000000) == 0)) {
              AddWindowToSortBuffer(&pIVar19->WindowsTempSortBuffer,pIVar25);
            }
            uVar40 = uVar40 + 1;
            uVar41 = (pIVar19->Windows).Size;
            uVar31 = (ulong)uVar41;
          } while (uVar40 != uVar31);
        }
        uVar42 = (pIVar19->WindowsTempSortBuffer).Size;
        if (uVar41 != uVar42) {
          __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x11d1,"void ImGui::EndFrame()");
        }
        (pIVar19->WindowsTempSortBuffer).Size = uVar41;
        (pIVar19->Windows).Size = uVar42;
        iVar36 = (pIVar19->WindowsTempSortBuffer).Capacity;
        (pIVar19->WindowsTempSortBuffer).Capacity = (pIVar19->Windows).Capacity;
        (pIVar19->Windows).Capacity = iVar36;
        ppIVar12 = (pIVar19->WindowsTempSortBuffer).Data;
        (pIVar19->WindowsTempSortBuffer).Data = (pIVar19->Windows).Data;
        (pIVar19->Windows).Data = ppIVar12;
        (pIVar19->IO).MetricsActiveWindows = pIVar19->WindowsActiveCount;
        ((pIVar19->IO).Fonts)->Locked = false;
        (pIVar19->IO).MouseWheel = 0.0;
        (pIVar19->IO).MouseWheelH = 0.0;
        iVar36 = (pIVar19->IO).InputQueueCharacters.Capacity;
        if (iVar36 < 0) {
          iVar36 = iVar36 / 2 + iVar36;
          iVar38 = 0;
          if (0 < iVar36) {
            iVar38 = iVar36;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (unsigned_short *)
                   (*GImAllocatorAllocFunc)((ulong)(uint)(iVar38 * 2),GImAllocatorUserData);
          puVar13 = (pIVar19->IO).InputQueueCharacters.Data;
          if (puVar13 != (unsigned_short *)0x0) {
            memcpy(__dest,puVar13,(long)(pIVar19->IO).InputQueueCharacters.Size * 2);
            puVar13 = (pIVar19->IO).InputQueueCharacters.Data;
            if ((puVar13 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(puVar13,GImAllocatorUserData);
          }
          (pIVar19->IO).InputQueueCharacters.Data = __dest;
          (pIVar19->IO).InputQueueCharacters.Capacity = iVar38;
        }
        (pIVar19->IO).InputQueueCharacters.Size = 0;
        (pIVar19->IO).NavInputs[0] = 0.0;
        (pIVar19->IO).NavInputs[1] = 0.0;
        (pIVar19->IO).NavInputs[2] = 0.0;
        (pIVar19->IO).NavInputs[3] = 0.0;
        (pIVar19->IO).NavInputs[4] = 0.0;
        (pIVar19->IO).NavInputs[5] = 0.0;
        (pIVar19->IO).NavInputs[6] = 0.0;
        (pIVar19->IO).NavInputs[7] = 0.0;
        (pIVar19->IO).NavInputs[8] = 0.0;
        (pIVar19->IO).NavInputs[9] = 0.0;
        (pIVar19->IO).NavInputs[10] = 0.0;
        (pIVar19->IO).NavInputs[0xb] = 0.0;
        (pIVar19->IO).NavInputs[0xc] = 0.0;
        (pIVar19->IO).NavInputs[0xd] = 0.0;
        (pIVar19->IO).NavInputs[0xe] = 0.0;
        (pIVar19->IO).NavInputs[0xf] = 0.0;
        (pIVar19->IO).NavInputs[0x10] = 0.0;
        (pIVar19->IO).NavInputs[0x11] = 0.0;
        (pIVar19->IO).NavInputs[0x12] = 0.0;
        (pIVar19->IO).NavInputs[0x13] = 0.0;
        (pIVar19->IO).NavInputs[0x14] = 0.0;
        if ((pIVar19->Hooks).Size < 1) {
          return;
        }
        lVar37 = 0;
        lVar39 = 0;
        do {
          pIVar7 = (pIVar19->Hooks).Data;
          if (*(int *)(pIVar7 + lVar37) == 3) {
            (**(code **)(pIVar7 + lVar37 + 8))(pIVar19,pIVar7 + lVar37);
          }
          lVar39 = lVar39 + 1;
          lVar37 = lVar37 + 0x18;
        } while (lVar39 < (pIVar19->Hooks).Size);
        return;
      }
    }
  }
  pcVar34 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_0013039a:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5c2,pcVar34);
LAB_00130385:
  pcVar34 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
  goto LAB_0013039a;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}